

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portmidi.c
# Opt level: O0

char * Pm_GetErrorText(PmError errnum)

{
  char *local_18;
  char *msg;
  PmError errnum_local;
  
  if (errnum == pmHostError) {
    local_18 = "PortMidi: `Host error\'";
  }
  else if (errnum == pmInvalidDeviceId) {
    local_18 = "PortMidi: `Invalid device ID\'";
  }
  else if (errnum == pmInsufficientMemory) {
    local_18 = "PortMidi: `Insufficient memory\'";
  }
  else if (errnum == pmBufferTooSmall) {
    local_18 = "PortMidi: `Buffer too small\'";
  }
  else if (errnum == pmBufferOverflow) {
    local_18 = "PortMidi: `Buffer overflow\'";
  }
  else if (errnum == pmBadPtr) {
    local_18 = "PortMidi: `Bad pointer\'";
  }
  else if (errnum == pmBadData) {
    local_18 = "PortMidi: `Invalid MIDI message Data\'";
  }
  else if (errnum == pmInternalError) {
    local_18 = "PortMidi: `Internal PortMidi Error\'";
  }
  else if (errnum == pmBufferMaxSize) {
    local_18 = "PortMidi: `Buffer cannot be made larger\'";
  }
  else if (errnum == pmNoData) {
    local_18 = "";
  }
  else {
    local_18 = "PortMidi: `Illegal error number\'";
  }
  return local_18;
}

Assistant:

PMEXPORT const char *Pm_GetErrorText( PmError errnum ) {
    const char *msg;

    switch(errnum)
    {
    case pmNoError:                  
        msg = ""; 
        break;
    case pmHostError:                
        msg = "PortMidi: `Host error'"; 
        break;
    case pmInvalidDeviceId:          
        msg = "PortMidi: `Invalid device ID'"; 
        break;
    case pmInsufficientMemory:       
        msg = "PortMidi: `Insufficient memory'"; 
        break;
    case pmBufferTooSmall:           
        msg = "PortMidi: `Buffer too small'"; 
        break;
    case pmBadPtr:                   
        msg = "PortMidi: `Bad pointer'"; 
        break;
    case pmInternalError:            
        msg = "PortMidi: `Internal PortMidi Error'"; 
        break;
    case pmBufferOverflow:
        msg = "PortMidi: `Buffer overflow'";
        break;
    case pmBadData:
        msg = "PortMidi: `Invalid MIDI message Data'";
        break;
    case pmBufferMaxSize:
        msg = "PortMidi: `Buffer cannot be made larger'";
        break;
    default:                         
        msg = "PortMidi: `Illegal error number'"; 
        break;
    }
    return msg;
}